

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O0

int posix_time_from_utc(int64_t year,int64_t month,int64_t day,int64_t hours,int64_t minutes,
                       int64_t seconds,int64_t *out_time)

{
  int iVar1;
  long lVar2;
  long local_80;
  long local_78;
  int64_t posix_days;
  int64_t day_of_era;
  int64_t day_of_year;
  int64_t year_of_era;
  int64_t era;
  int64_t seconds_local;
  int64_t minutes_local;
  int64_t hours_local;
  int64_t day_local;
  int64_t month_local;
  int64_t year_local;
  
  iVar1 = is_valid_date(year,month,day);
  if ((iVar1 == 0) || (iVar1 = is_valid_time(hours,minutes,seconds), iVar1 == 0)) {
    year_local._4_4_ = 0;
  }
  else {
    month_local = year;
    if (month < 3) {
      month_local = year + -1;
    }
    if (month_local < -1 || 9999 < month_local) {
      __assert_fail("-1 <= year && year <= 9999",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/posix_time.cc"
                    ,0x61,
                    "int posix_time_from_utc(int64_t, int64_t, int64_t, int64_t, int64_t, int64_t, int64_t *)"
                   );
    }
    if (month_local < 0) {
      local_78 = month_local + -399;
    }
    else {
      local_78 = month_local;
    }
    lVar2 = month_local + (local_78 / 400) * -400;
    if (month < 3) {
      local_80 = month + 9;
    }
    else {
      local_80 = month + -3;
    }
    *out_time = ((local_78 / 400) * 0x23ab1 +
                 ((lVar2 * 0x16d + lVar2 / 4) - lVar2 / 100) + (local_80 * 0x99 + 2) / 5 + day +
                -0xafa6d) * 0x15180 + hours * 0xe10 + minutes * 0x3c + seconds;
    year_local._4_4_ = 1;
  }
  return year_local._4_4_;
}

Assistant:

static int posix_time_from_utc(int64_t year, int64_t month, int64_t day,
                               int64_t hours, int64_t minutes, int64_t seconds,
                               int64_t *out_time) {
  if (!is_valid_date(year, month, day) ||
      !is_valid_time(hours, minutes, seconds)) {
    return 0;
  }
  if (month <= 2) {
    year--;  // Start years on Mar 1, so leap days always finish a year.
  }
  // At this point year will be in the range -1 and 9999.
  assert(-1 <= year && year <= 9999);
  int64_t era = (year >= 0 ? year : year - 399) / 400;
  int64_t year_of_era = year - era * 400;
  int64_t day_of_year =
      (153 * (month > 2 ? month - 3 : month + 9) + 2) / 5 + day - 1;
  int64_t day_of_era =
      year_of_era * 365 + year_of_era / 4 - year_of_era / 100 + day_of_year;
  int64_t posix_days = era * 146097 + day_of_era - 719468;
  *out_time = posix_days * SECS_PER_DAY + hours * SECS_PER_HOUR + minutes * 60 +
              seconds;
  return 1;
}